

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnMemoryCopy
          (SharedValidator *this,Location *loc,Var *destmemidx,Var *srcmemidx)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  MemoryType dstmt;
  MemoryType srcmt;
  Limits local_f8;
  Limits local_d8;
  Var local_c0;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0xd1,loc);
  local_d8.initial = 0;
  local_d8.max._0_7_ = 0;
  local_d8._15_4_ = 0;
  local_f8.initial = 0;
  local_f8.max._0_7_ = 0;
  local_f8._15_4_ = 0;
  Var::Var(&local_78,destmemidx);
  RVar2 = CheckMemoryIndex(this,&local_78,(MemoryType *)&local_f8);
  Var::~Var(&local_78);
  Var::Var(&local_c0,srcmemidx);
  RVar3 = CheckMemoryIndex(this,&local_c0,(MemoryType *)&local_d8);
  Var::~Var(&local_c0);
  RVar4 = TypeChecker::OnMemoryCopy(&this->typechecker_,&local_f8,&local_d8);
  RVar1.enum_._0_1_ =
       (RVar4.enum_ == Error || RVar3.enum_ == Error) ||
       (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnMemoryCopy(const Location& loc,
                                     Var destmemidx,
                                     Var srcmemidx) {
  Result result = CheckInstr(Opcode::MemoryCopy, loc);
  MemoryType srcmt;
  MemoryType dstmt;
  result |= CheckMemoryIndex(destmemidx, &dstmt);
  result |= CheckMemoryIndex(srcmemidx, &srcmt);
  result |= typechecker_.OnMemoryCopy(dstmt.limits, srcmt.limits);
  return result;
}